

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::SparseTextureCommitmentTestCase::iterate(SparseTextureCommitmentTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  uint *puVar6;
  uint *puVar7;
  char *description;
  uint uVar8;
  qpTestResult testResult;
  TestContext *this_01;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  long lVar12;
  GLuint texture;
  undefined1 local_1f4 [4];
  long local_1f0;
  string *local_1e8;
  uint *local_1e0;
  ostream *local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    puVar9 = (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start;
    puVar6 = (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_finish;
    if (puVar9 != puVar6) {
      local_1e8 = (string *)&this->field_0x90;
      local_1d8 = (ostream *)&this->field_0x88;
      puVar7 = (uint *)(this->mSupportedInternalFormats).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
      local_1f0 = CONCAT44(extraout_var,iVar2);
      do {
        puVar10 = (uint *)(this->mSupportedInternalFormats).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        if (puVar10 != puVar7) {
          do {
            iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                              (this,(ulong)*puVar9,(ulong)*puVar10);
            if ((char)iVar2 != '\0') {
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1aee929);
              std::__cxx11::stringbuf::str(local_1e8);
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              poVar5 = local_1d8;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1d8,"Testing sparse texture commitment for target: ",0x2e);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
              lVar12 = local_1f0;
              (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                        (this,local_1f0,(ulong)*puVar9,(ulong)*puVar10,local_1f4,3);
              if ((this->mState).levels < 1) {
LAB_00a54be3:
                (**(code **)(lVar12 + 0x480))(1,local_1f4);
                dVar4 = (**(code **)(lVar12 + 0x800))();
                glu::checkError(dVar4,"GenTextures",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                                ,0xd4);
LAB_00a54c1a:
                iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                                  (this,lVar12,(ulong)*puVar9,(ulong)*puVar10,local_1f4);
                if (((char)iVar2 != '\0') &&
                   (iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                              [0x10])(this,lVar12,(ulong)*puVar9,(ulong)*puVar10,local_1f4),
                   (char)iVar2 != '\0')) goto LAB_00a54c57;
              }
              else {
                uVar8 = 0;
                do {
                  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                            (this,lVar12,(ulong)*puVar9,(ulong)*puVar10,local_1f4,(ulong)uVar8);
                  uVar8 = uVar8 + 1;
                  iVar2 = (this->mState).levels;
                } while ((int)uVar8 < iVar2);
                if (iVar2 < 1) goto LAB_00a54be3;
                uVar8 = 1;
                iVar2 = 1;
                local_1e0 = puVar10;
                do {
                  uVar11 = iVar2 - 1;
                  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc]
                          )(this,local_1f0,(ulong)*puVar9,(ulong)*puVar10,local_1f4,(ulong)uVar11);
                  lVar12 = local_1f0;
                  if ((char)iVar3 != '\0') {
                    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                              (this,local_1f0,(ulong)*puVar9,(ulong)*puVar10,local_1f4,(ulong)uVar11
                              );
                    puVar10 = local_1e0;
                    uVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                              [0xb])(this,lVar12,(ulong)*puVar9,(ulong)*local_1e0,local_1f4,
                                     (ulong)uVar11);
                  }
                  lVar12 = local_1f0;
                } while (((uVar8 & 1) != 0) &&
                        (bVar1 = iVar2 < (this->mState).levels, iVar2 = iVar2 + 1, bVar1));
                (**(code **)(local_1f0 + 0x480))(1,local_1f4);
                dVar4 = (**(code **)(lVar12 + 0x800))();
                glu::checkError(dVar4,"GenTextures",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                                ,0xd4);
                if ((uVar8 & 1) != 0) goto LAB_00a54c1a;
              }
              local_1b0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,(char *)local_1d0,local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if (local_1d0 != local_1c0) {
                operator_delete(local_1d0,local_1c0[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00a54d4c;
            }
LAB_00a54c57:
            puVar7 = puVar10 + 1;
            puVar10 = puVar7;
          } while (puVar7 != (uint *)(this->mSupportedInternalFormats).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
          puVar6 = (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar6);
    }
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00a54d4c:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into not committed region generates no error
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
				writeDataToTexture(gl, target, format, texture, l);

			//Checking if written data into committed region is as expected
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}